

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O1

void __thiscall
t_cpp_generator::generate_exception_what_method
          (t_cpp_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  t_cpp_generator *ptVar2;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  t_cpp_generator *this_00;
  undefined1 local_48 [32];
  
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  std::__ostream_insert<char,std::char_traits<char>>(out,(char *)local_48._0_8_,local_48._8_8_);
  ptVar2 = (t_cpp_generator *)(local_48 + 0x10);
  this_00 = (t_cpp_generator *)local_48._0_8_;
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  generate_exception_what_method_decl(this_00,out,tstruct,true);
  std::__ostream_insert<char,std::char_traits<char>>(out," {",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"try {",5);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"std::stringstream ss;",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"ss << \"TException - service has thrown: \" << *this;",0x33);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"this->thriftTExceptionMessageHolder_ = ss.str();",0x30);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"return this->thriftTExceptionMessageHolder_.c_str();",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"} catch (const std::exception&) {",0x21);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"return \"TException - service has thrown: ",0x29);
  iVar3 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,*(char **)CONCAT44(extraout_var,iVar3),
                      ((undefined8 *)CONCAT44(extraout_var,iVar3))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\";",2);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_((string *)local_48,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,(char *)local_48._0_8_,local_48._8_8_);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((t_cpp_generator *)local_48._0_8_ != ptVar2) {
    operator_delete((void *)local_48._0_8_);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>(out,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  return;
}

Assistant:

void t_cpp_generator::generate_exception_what_method(std::ostream& out, t_struct* tstruct) {
  out << indent();
  generate_exception_what_method_decl(out, tstruct, true);
  out << " {" << endl;

  indent_up();
  out << indent() << "try {" << endl;

  indent_up();
  out << indent() << "std::stringstream ss;" << endl;
  out << indent() << "ss << \"TException - service has thrown: \" << *this;" << endl;
  out << indent() << "this->thriftTExceptionMessageHolder_ = ss.str();" << endl;
  out << indent() << "return this->thriftTExceptionMessageHolder_.c_str();" << endl;
  indent_down();

  out << indent() << "} catch (const std::exception&) {" << endl;

  indent_up();
  out << indent() << "return \"TException - service has thrown: " << tstruct->get_name() << "\";"
      << endl;
  indent_down();

  out << indent() << "}" << endl;

  indent_down();
  out << "}" << endl << endl;
}